

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool.c
# Opt level: O3

int run_test_threadpool_queue_work_simple(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  int iVar3;
  
  work_req.data = &data;
  puVar2 = uv_default_loop();
  iVar3 = 0x51f638;
  iVar1 = uv_queue_work(puVar2,&work_req,work_cb,after_work_cb);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar3 = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (work_cb_count != 1) goto LAB_0017417e;
    if (after_work_cb_count != 1) goto LAB_00174183;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    iVar3 = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_threadpool_queue_work_simple_cold_1();
LAB_0017417e:
    run_test_threadpool_queue_work_simple_cold_2();
LAB_00174183:
    run_test_threadpool_queue_work_simple_cold_3();
  }
  run_test_threadpool_queue_work_simple_cold_4();
  if (puVar2 == (uv_loop_t *)&work_req) {
    if ((char *)work_req.data == &data) {
      work_cb_count = work_cb_count + 1;
      return extraout_EAX;
    }
  }
  else {
    work_cb_cold_1();
  }
  work_cb_cold_2();
  if (iVar3 == 0) {
    if (puVar2 != (uv_loop_t *)&work_req) goto LAB_001741ea;
    if ((char *)work_req.data == &data) {
      after_work_cb_count = after_work_cb_count + 1;
      return extraout_EAX_00;
    }
  }
  else {
    after_work_cb_cold_1();
LAB_001741ea:
    after_work_cb_cold_2();
  }
  after_work_cb_cold_3();
  work_req.data = &data;
  puVar2 = uv_default_loop();
  iVar1 = uv_queue_work(puVar2,&work_req,(uv_work_cb)0x0,after_work_cb);
  if (iVar1 == -0x16) {
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (work_cb_count != 0) goto LAB_00174286;
    if (after_work_cb_count == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00174290;
    }
  }
  else {
    run_test_threadpool_queue_work_einval_cold_1();
LAB_00174286:
    run_test_threadpool_queue_work_einval_cold_2();
  }
  run_test_threadpool_queue_work_einval_cold_3();
LAB_00174290:
  run_test_threadpool_queue_work_einval_cold_4();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(threadpool_queue_work_simple) {
  int r;

  work_req.data = &data;
  r = uv_queue_work(uv_default_loop(), &work_req, work_cb, after_work_cb);
  ASSERT(r == 0);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(work_cb_count == 1);
  ASSERT(after_work_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}